

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_std::create_basic_parsing<wchar_t>(locale *in,string *locale_name)

{
  char *pcVar1;
  ulong uVar2;
  locale *in_RSI;
  _Impl *in_RDI;
  locale *tmp;
  _Impl *__other;
  locale local_48;
  locale local_40;
  locale local_38 [3];
  undefined1 local_19;
  
  local_19 = 0;
  __other = in_RDI;
  pcVar1 = (char *)operator_new(0x18);
  uVar2 = std::__cxx11::string::c_str();
  std::__cxx11::numpunct_byname<wchar_t>::numpunct_byname(pcVar1,uVar2);
  std::locale::locale<std::__cxx11::numpunct_byname<wchar_t>>
            (in_RSI,(locale *)__other,(numpunct_byname<wchar_t> *)in_RDI);
  pcVar1 = (char *)operator_new(0x18);
  uVar2 = std::__cxx11::string::c_str();
  std::__cxx11::moneypunct_byname<wchar_t,true>::moneypunct_byname(pcVar1,uVar2);
  std::locale::locale<std::__cxx11::moneypunct_byname<wchar_t,true>>
            (in_RSI,(locale *)__other,(moneypunct_byname<wchar_t,_true> *)in_RDI);
  std::locale::operator=((locale *)in_RDI,local_38);
  std::locale::~locale(local_38);
  pcVar1 = (char *)operator_new(0x18);
  uVar2 = std::__cxx11::string::c_str();
  std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname(pcVar1,uVar2);
  std::locale::locale<std::__cxx11::moneypunct_byname<wchar_t,false>>
            (in_RSI,(locale *)__other,(moneypunct_byname<wchar_t,_false> *)in_RDI);
  std::locale::operator=((locale *)in_RDI,&local_40);
  std::locale::~locale(&local_40);
  pcVar1 = (char *)operator_new(0x540);
  uVar2 = std::__cxx11::string::c_str();
  std::ctype_byname<wchar_t>::ctype_byname(pcVar1,uVar2);
  std::locale::locale<std::ctype_byname<wchar_t>>
            (in_RSI,(locale *)__other,(ctype_byname<wchar_t> *)in_RDI);
  std::locale::operator=((locale *)in_RDI,&local_48);
  std::locale::~locale(&local_48);
  return (locale)__other;
}

Assistant:

std::locale create_basic_parsing(std::locale const &in,std::string const &locale_name)
{
    std::locale tmp = std::locale(in,new std::numpunct_byname<CharType>(locale_name.c_str()));
    tmp = std::locale(tmp,new std::moneypunct_byname<CharType,true>(locale_name.c_str()));
    tmp = std::locale(tmp,new std::moneypunct_byname<CharType,false>(locale_name.c_str()));
    tmp = std::locale(tmp,new std::ctype_byname<CharType>(locale_name.c_str()));
    return tmp;
}